

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void nodeOverwriteCell(Rtree *pRtree,RtreeNode *pNode,RtreeCell *pCell,int iCell)

{
  uint uVar1;
  u8 *puVar2;
  long lVar3;
  ulong uVar4;
  
  lVar3 = (long)iCell * (ulong)pRtree->nBytesPerCell;
  uVar4 = pCell->iRowid;
  puVar2 = pNode->zData;
  *(ulong *)(puVar2 + lVar3 + 4) =
       uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
       (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
       (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  if (pRtree->nDim2 != '\0') {
    uVar4 = 0;
    do {
      uVar1 = pCell->aCoord[uVar4].u;
      *(uint *)(puVar2 + uVar4 * 4 + lVar3 + 0xc) =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar4 = uVar4 + 1;
    } while (uVar4 < pRtree->nDim2);
  }
  pNode->isDirty = 1;
  return;
}

Assistant:

static void nodeOverwriteCell(
  Rtree *pRtree,             /* The overall R-Tree */
  RtreeNode *pNode,          /* The node into which the cell is to be written */
  RtreeCell *pCell,          /* The cell to write */
  int iCell                  /* Index into pNode into which pCell is written */
){
  int ii;
  u8 *p = &pNode->zData[4 + pRtree->nBytesPerCell*iCell];
  p += writeInt64(p, pCell->iRowid);
  for(ii=0; ii<pRtree->nDim2; ii++){
    p += writeCoord(p, &pCell->aCoord[ii]);
  }
  pNode->isDirty = 1;
}